

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

char ** lua_rl_complete(char *text,int start,int end)

{
  int idx;
  int iVar1;
  ushort **ppuVar2;
  lua_State *plVar3;
  char *pcVar4;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int suf;
  int savetop;
  size_t loop;
  size_t dot;
  size_t n;
  size_t i;
  char *s;
  dmlist ml;
  lua_State *L;
  uint in_stack_ffffffffffffff88;
  uint uVar5;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  lua_State *in_stack_ffffffffffffff98;
  lua_State *L_00;
  lua_State *L_01;
  lua_State *L_02;
  char *in_stack_ffffffffffffffb8;
  char **p;
  dmlist *ml_00;
  
  plVar3 = lua_rl_L;
  if (((*in_RDI == '\0') || (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*in_RDI] & 0x400) != 0)) ||
     (*in_RDI == '_')) {
    p = (char **)0x0;
    ml_00 = (dmlist *)0x0;
    idx = lua_gettop(plVar3);
    lua_pushvalue(in_stack_ffffffffffffff98,idx);
    plVar3 = (lua_State *)(long)(in_EDX - in_ESI);
    L_01 = (lua_State *)0x0;
    for (L_02 = (lua_State *)0x0; L_02 < plVar3;
        L_02 = (lua_State *)((long)&(L_02->nextgc).gcptr32 + 1)) {
      if ((in_RDI[(long)L_02] == '.') || (in_RDI[(long)L_02] == ':')) {
        iVar1 = lua_rl_getfield(in_stack_ffffffffffffff98,
                                (char *)CONCAT44(idx,in_stack_ffffffffffffff90),
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if (iVar1 == 0) goto LAB_00109479;
        L_01 = (lua_State *)((long)&(L_02->nextgc).gcptr32 + 1);
      }
    }
    if (L_01 == (lua_State *)0x0) {
      for (L_02 = (lua_State *)0x0; pcVar4 = lua_rl_keywords[(long)L_02], pcVar4 != (char *)0x0;
          L_02 = (lua_State *)((long)&(L_02->nextgc).gcptr32 + 1)) {
        iVar1 = strncmp(pcVar4,in_RDI,(size_t)plVar3);
        if ((iVar1 == 0) &&
           (iVar1 = lua_rl_dmadd(ml_00,(char *)p,(size_t)pcVar4,(char *)L_02,
                                 (int)((ulong)plVar3 >> 0x20)), iVar1 != 0)) goto LAB_00109479;
      }
      in_stack_ffffffffffffffb8 = (char *)0x0;
    }
    L_00 = (lua_State *)0x0;
    do {
      iVar1 = lua_type(L_00,idx);
      if ((iVar1 == 5) &&
         ((L_00 == (lua_State *)0x0 ||
          (iVar1 = lua_rawequal(L_01,(int)((ulong)L_00 >> 0x20),(int)L_00), iVar1 == 0)))) {
        lua_pushnil((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff90));
        while (iVar1 = lua_next(L_01,(int)((ulong)L_00 >> 0x20)), iVar1 != 0) {
          iVar1 = lua_type(L_00,idx);
          if (iVar1 == 4) {
            in_stack_ffffffffffffffb8 =
                 lua_tolstring(L_01,(int)((ulong)L_00 >> 0x20),
                               (size_t *)CONCAT44(idx,in_stack_ffffffffffffff90));
            iVar1 = strncmp(in_stack_ffffffffffffffb8,in_RDI + (long)L_01,(long)plVar3 - (long)L_01)
            ;
            if (((iVar1 == 0) &&
                (iVar1 = valididentifier((char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                          in_stack_ffffffffffffff88)), iVar1 != 0))
               && ((*in_stack_ffffffffffffffb8 != '_' || (in_RDI[(long)L_01] == '_')))) {
              in_stack_ffffffffffffff90 = 0x20;
              in_stack_ffffffffffffff8c = lua_type(L_00,idx);
              if (in_stack_ffffffffffffff8c == 5) {
                in_stack_ffffffffffffff90 = 0x2e;
              }
              else if (in_stack_ffffffffffffff8c == 6) {
                in_stack_ffffffffffffff90 = 0x28;
              }
              else if ((in_stack_ffffffffffffff8c == 7) &&
                      (iVar1 = lua_getmetatable(L_02,(int)((ulong)plVar3 >> 0x20)), iVar1 != 0)) {
                lua_settop((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c);
                in_stack_ffffffffffffff90 = 0x3a;
              }
              iVar1 = lua_rl_dmadd(ml_00,(char *)p,(size_t)in_stack_ffffffffffffffb8,(char *)L_02,
                                   (int)((ulong)plVar3 >> 0x20));
              if (iVar1 != 0) goto LAB_00109479;
            }
          }
          lua_settop((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c)
          ;
        }
      }
      L_00 = (lua_State *)((long)&(L_00->nextgc).gcptr32 + 1);
      uVar5 = in_stack_ffffffffffffff88 & 0xffffff;
      if (L_00 < (lua_State *)0x14) {
        iVar1 = lua_rl_getmetaindex((lua_State *)
                                    (CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88) &
                                    0xffffffff00ffffff));
        uVar5 = CONCAT13(iVar1 != 0,(int3)uVar5);
      }
      in_stack_ffffffffffffff88 = uVar5;
    } while ((char)(uVar5 >> 0x18) != '\0');
    if (ml_00 != (dmlist *)0x0) {
      pcVar4 = (char *)malloc(1);
      iVar1 = (int)((ulong)plVar3 >> 0x20);
      *p = pcVar4;
      if (pcVar4 != (char *)0x0) {
        memcpy(*p,p[1],0);
        **p = '\0';
        iVar1 = lua_rl_dmadd(ml_00,(char *)p,(size_t)in_stack_ffffffffffffffb8,(char *)L_02,iVar1);
        if (iVar1 == 0) {
          lua_settop((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c)
          ;
          _rl_completion_suppress_append = 1;
          return p;
        }
      }
    }
LAB_00109479:
    lua_settop((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
  }
  return (char **)0x0;
}

Assistant:

static char **lua_rl_complete(const char *text, int start, int end)
{
  lua_State *L = lua_rl_L;
  dmlist ml;
  const char *s;
  size_t i, n, dot, loop;
  int savetop;

  if (!(text[0] == '\0' || isalpha(text[0]) || text[0] == '_')) return NULL;

  ml.list = NULL;
  ml.idx = ml.allocated = ml.matchlen = 0;

  savetop = lua_gettop(L);
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  for (n = (size_t)(end-start), i = dot = 0; i < n; i++)
    if (text[i] == '.' || text[i] == ':') {
      if (!lua_rl_getfield(L, text+dot, i-dot))
	goto error;  /* Invalid prefix. */
      dot = i+1;  /* Points to first char after dot/colon. */
    }

  /* Add all matches against keywords if there is no dot/colon. */
  if (dot == 0)
    for (i = 0; (s = lua_rl_keywords[i]) != NULL; i++)
      if (!strncmp(s, text, n) && lua_rl_dmadd(&ml, NULL, 0, s, ' '))
	goto error;

  /* Add all valid matches from all tables/metatables. */
  loop = 0;  /* Avoid infinite metatable loops. */
  do {
    if (lua_istable(L, -1) &&
	(loop == 0 || !lua_rawequal(L, -1, LUA_GLOBALSINDEX)))
      for (lua_pushnil(L); lua_next(L, -2); lua_pop(L, 1))
	if (lua_type(L, -2) == LUA_TSTRING) {
	  s = lua_tostring(L, -2);
	  /* Only match names starting with '_' if explicitly requested. */
	  if (!strncmp(s, text+dot, n-dot) && valididentifier(s) &&
	      (*s != '_' || text[dot] == '_')) {
	    int suf = ' ';  /* Default suffix is a space. */
	    switch (lua_type(L, -1)) {
	    case LUA_TTABLE:	suf = '.'; break;  /* No way to guess ':'. */
	    case LUA_TFUNCTION:	suf = '('; break;
	    case LUA_TUSERDATA:
	      if (lua_getmetatable(L, -1)) { lua_pop(L, 1); suf = ':'; }
	      break;
	    }
	    if (lua_rl_dmadd(&ml, text, dot, s, suf)) goto error;
	  }
	}
  } while (++loop < 20 && lua_rl_getmetaindex(L));

  if (ml.idx == 0) {
error:
    lua_settop(L, savetop);
    return NULL;
  } else {
    /* list[0] holds the common prefix of all matches (may be ""). */
    /* If there is only one match, list[0] and list[1] will be the same. */
    if (!(ml.list[0] = (char *)malloc(sizeof(char)*(ml.matchlen+1))))
      goto error;
    memcpy(ml.list[0], ml.list[1], ml.matchlen);
    ml.list[0][ml.matchlen] = '\0';
    /* Add the NULL list terminator. */
    if (lua_rl_dmadd(&ml, NULL, 0, NULL, 0)) goto error;
  }

  lua_settop(L, savetop);
#if RL_READLINE_VERSION >= 0x0600
  rl_completion_suppress_append = 1;
#endif
  return ml.list;
}